

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O1

void __thiscall
xmrig::Workers<xmrig::OclLaunchData>::start
          (Workers<xmrig::OclLaunchData> *this,
          vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *data)

{
  pointer *pppTVar1;
  IBackend *pIVar2;
  iterator __position;
  pointer ppTVar3;
  int64_t iVar4;
  Miner *pMVar5;
  cl_platform_id p_Var6;
  size_t sVar7;
  size_t sVar8;
  _WordT _Var9;
  bool bVar10;
  undefined7 uVar11;
  uint32_t uVar12;
  OclVendor OVar13;
  PciTopology PVar14;
  undefined6 uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  Thread<xmrig::OclLaunchData> *pTVar22;
  Hashrate *this_00;
  pointer ppTVar23;
  pointer pOVar24;
  Thread<xmrig::OclLaunchData> *local_50;
  pointer local_48;
  Thread<xmrig::OclLaunchData> *local_40;
  thread local_38;
  
  pOVar24 = (data->super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_48 = (data->super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar24 != local_48) {
    do {
      pTVar22 = (Thread<xmrig::OclLaunchData> *)operator_new(0x100);
      pIVar2 = this->d_ptr->backend;
      pTVar22->m_id =
           (long)(this->m_workers).
                 super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_workers).
                 super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      bVar10 = pOVar24->cache;
      uVar11 = *(undefined7 *)&pOVar24->field_0x9;
      iVar4 = pOVar24->affinity;
      pMVar5 = pOVar24->miner;
      (pTVar22->m_config).ctx = pOVar24->ctx;
      (pTVar22->m_config).cache = bVar10;
      *(undefined7 *)&(pTVar22->m_config).field_0x9 = uVar11;
      (pTVar22->m_config).affinity = iVar4;
      (pTVar22->m_config).miner = pMVar5;
      p_Var6 = (pOVar24->device).m_platform;
      (pTVar22->m_config).device.m_id = (pOVar24->device).m_id;
      (pTVar22->m_config).device.m_platform = p_Var6;
      String::String(&(pTVar22->m_config).device.m_board,&(pOVar24->device).m_board);
      String::String(&(pTVar22->m_config).device.m_name,&(pOVar24->device).m_name);
      String::String(&(pTVar22->m_config).device.m_vendor,&(pOVar24->device).m_vendor);
      (pTVar22->m_config).device.m_type = (pOVar24->device).m_type;
      sVar7 = (pOVar24->device).m_maxMemoryAlloc;
      sVar8 = (pOVar24->device).m_globalMemory;
      uVar12 = (pOVar24->device).m_index;
      OVar13 = (pOVar24->device).m_vendorId;
      PVar14 = (pOVar24->device).m_topology;
      (pTVar22->m_config).device.m_computeUnits = (pOVar24->device).m_computeUnits;
      (pTVar22->m_config).device.m_index = uVar12;
      (pTVar22->m_config).device.m_vendorId = OVar13;
      (pTVar22->m_config).device.m_topology = PVar14;
      (pTVar22->m_config).device.m_maxMemoryAlloc = sVar7;
      (pTVar22->m_config).device.m_globalMemory = sVar8;
      sVar7 = (pOVar24->platform).m_index;
      (pTVar22->m_config).platform.m_id = (pOVar24->platform).m_id;
      (pTVar22->m_config).platform.m_index = sVar7;
      bVar10 = (pOVar24->thread).m_gcnAsm;
      uVar15 = *(undefined6 *)&(pOVar24->thread).field_0x2;
      _Var9 = (pOVar24->thread).m_fields.super__Base_bitset<1UL>._M_w;
      (pTVar22->m_config).thread.m_datasetHost = (pOVar24->thread).m_datasetHost;
      (pTVar22->m_config).thread.m_gcnAsm = bVar10;
      *(undefined6 *)&(pTVar22->m_config).thread.field_0x2 = uVar15;
      (pTVar22->m_config).thread.m_fields.super__Base_bitset<1UL>._M_w = _Var9;
      std::vector<long,_std::allocator<long>_>::vector
                (&(pTVar22->m_config).thread.m_threads,&(pOVar24->thread).m_threads);
      uVar18 = (pOVar24->thread).m_bfactor;
      uVar19 = (pOVar24->thread).m_index;
      uVar20 = (pOVar24->thread).m_intensity;
      uVar21 = (pOVar24->thread).m_memChunk;
      uVar12 = (pOVar24->thread).m_stridedIndex;
      uVar16 = (pOVar24->thread).m_unrollFactor;
      uVar17 = (pOVar24->thread).m_worksize;
      (pTVar22->m_config).thread.m_memChunk = (pOVar24->thread).m_memChunk;
      (pTVar22->m_config).thread.m_stridedIndex = uVar12;
      (pTVar22->m_config).thread.m_unrollFactor = uVar16;
      (pTVar22->m_config).thread.m_worksize = uVar17;
      (pTVar22->m_config).thread.m_bfactor = uVar18;
      (pTVar22->m_config).thread.m_index = uVar19;
      (pTVar22->m_config).thread.m_intensity = uVar20;
      (pTVar22->m_config).thread.m_memChunk = uVar21;
      pTVar22->m_backend = pIVar2;
      pTVar22->m_worker = (IWorker *)0x0;
      (pTVar22->m_thread)._M_id._M_thread = 0;
      __position._M_current =
           (this->m_workers).
           super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = pTVar22;
      if (__position._M_current ==
          (this->m_workers).
          super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<xmrig::Thread<xmrig::OclLaunchData>*,std::allocator<xmrig::Thread<xmrig::OclLaunchData>*>>
        ::_M_realloc_insert<xmrig::Thread<xmrig::OclLaunchData>*>
                  ((vector<xmrig::Thread<xmrig::OclLaunchData>*,std::allocator<xmrig::Thread<xmrig::OclLaunchData>*>>
                    *)this,__position,&local_50);
      }
      else {
        *__position._M_current = pTVar22;
        pppTVar1 = &(this->m_workers).
                    super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      pOVar24 = pOVar24 + 1;
    } while (pOVar24 != local_48);
  }
  this_00 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_00,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_00;
  LOCK();
  DAT_001b1e48 = DAT_001b1e48 + 1;
  UNLOCK();
  ppTVar23 = (this->m_workers).
             super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar23 != ppTVar3) {
    do {
      pTVar22 = *ppTVar23;
      local_50 = (Thread<xmrig::OclLaunchData> *)onReady;
      local_40 = pTVar22;
      std::thread::thread<void(*&)(void*),xmrig::Thread<xmrig::OclLaunchData>*,void>
                (&local_38,(_func_void_void_ptr **)&local_50,&local_40);
      if ((pTVar22->m_thread)._M_id._M_thread != 0) {
        std::terminate();
      }
      (pTVar22->m_thread)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
      ppTVar23 = ppTVar23 + 1;
    } while (ppTVar23 != ppTVar3);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}